

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseXMLParser.cpp
# Opt level: O1

bool __thiscall Rml::BaseXMLParser::ReadCDATA(BaseXMLParser *this,char *tag_terminator)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long *plVar4;
  size_type *psVar5;
  String tag;
  String tag_name;
  String cdata;
  String local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  String local_c0;
  String local_a0;
  String local_80;
  String *local_60;
  char *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_58 = tag_terminator;
  if (tag_terminator == (char *)0x0) {
    FindString(this,"]]>",&local_a0,false);
    bVar1 = true;
    ::std::__cxx11::string::_M_append((char *)&this->data,(ulong)local_a0._M_dataplus._M_p);
  }
  else {
    local_60 = &this->data;
    while( true ) {
      bVar1 = FindString(this,"<",&local_a0,false);
      if (!bVar1) break;
      bVar1 = PeekString(this,"/",false);
      if (bVar1) {
        local_e0._M_string_length = 0;
        local_e0.field_2._M_local_buf[0] = '\0';
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        bVar1 = FindString(this,">",&local_e0,false);
        if (bVar1) {
          lVar3 = ::std::__cxx11::string::find((char)&local_e0,0x2f);
          if (lVar3 == -1) {
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_100,local_e0._M_dataplus._M_p,
                       local_e0._M_dataplus._M_p + local_e0._M_string_length);
          }
          else {
            ::std::__cxx11::string::substr((ulong)&local_100,(ulong)&local_e0);
          }
          StringUtilities::StripWhitespace(&local_c0,&local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          }
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p == &local_c0.field_2) {
            local_80.field_2._8_8_ = local_c0.field_2._8_8_;
          }
          else {
            local_80._M_dataplus._M_p = local_c0._M_dataplus._M_p;
          }
          local_80.field_2._M_allocated_capacity._1_7_ =
               local_c0.field_2._M_allocated_capacity._1_7_;
          local_80.field_2._M_local_buf[0] = local_c0.field_2._M_local_buf[0];
          local_80._M_string_length = local_c0._M_string_length;
          local_c0._M_string_length = 0;
          local_c0.field_2._M_local_buf[0] = '\0';
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          StringUtilities::ToLower(&local_80);
          iVar2 = ::std::__cxx11::string::compare((char *)&local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          if (iVar2 == 0) {
            ::std::__cxx11::string::_M_append((char *)local_60,(ulong)local_a0._M_dataplus._M_p);
          }
          else {
            ::std::operator+(&local_50,'<',&local_e0);
            plVar4 = (long *)::std::__cxx11::string::_M_replace_aux
                                       ((ulong)&local_50,local_50._M_string_length,0,'\x01');
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            psVar5 = (size_type *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar5) {
              local_100.field_2._M_allocated_capacity = *psVar5;
              local_100.field_2._8_8_ = plVar4[3];
            }
            else {
              local_100.field_2._M_allocated_capacity = *psVar5;
              local_100._M_dataplus._M_p = (pointer)*plVar4;
            }
            local_100._M_string_length = plVar4[1];
            *plVar4 = (long)psVar5;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_100._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,
                            CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                                     local_c0.field_2._M_local_buf[0]) + 1);
          }
          if (iVar2 == 0) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p,
                              CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                                       local_e0.field_2._M_local_buf[0]) + 1);
            }
            bVar1 = true;
            goto LAB_001e3353;
          }
        }
        else {
          ::std::__cxx11::string::append((char *)&local_a0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,
                          CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                                   local_e0.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        ::std::__cxx11::string::append((char *)&local_a0);
      }
    }
    bVar1 = false;
  }
LAB_001e3353:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,
                    CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                             local_a0.field_2._M_local_buf[0]) + 1);
  }
  return bVar1;
}

Assistant:

bool BaseXMLParser::ReadCDATA(const char* tag_terminator)
{
	String cdata;
	if (tag_terminator == nullptr)
	{
		FindString("]]>", cdata);
		data += cdata;
		return true;
	}
	else
	{
		for (;;)
		{
			// Search for the next tag opening.
			if (!FindString("<", cdata))
				return false;

			if (PeekString("/", false))
			{
				String tag;
				if (FindString(">", tag))
				{
					size_t slash_pos = tag.find('/');
					String tag_name = StringUtilities::StripWhitespace(slash_pos == String::npos ? tag : tag.substr(slash_pos + 1));
					if (StringUtilities::ToLower(std::move(tag_name)) == tag_terminator)
					{
						data += cdata;
						return true;
					}
					else
					{
						cdata += '<' + tag + '>';
					}
				}
				else
					cdata += "<";
			}
			else
				cdata += "<";
		}
	}
}